

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O0

int256_t *
(anonymous_namespace)::
S2_easy_OpenMP<primesum::int256_t,std::vector<long,std::allocator<long>>,std::vector<__int128,std::allocator<__int128>>>
          (uint128_t x,int64_t y,int64_t z,int64_t c,vector<long,_std::allocator<long>_> *primes,
          vector<__int128,_std::allocator<__int128>_> *prime_sums,int threads)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 limit [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 a [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  undefined1 x_07 [16];
  undefined1 x_08 [16];
  undefined8 uVar3;
  int iVar4;
  size_type *psVar5;
  uint64_t *puVar6;
  long *plVar7;
  int64_t iVar8;
  size_type __n;
  ulong *puVar9;
  reference pvVar10;
  long in_RCX;
  ulong uVar11;
  undefined8 in_RDX;
  int256_t *extraout_RDX;
  undefined8 in_RSI;
  int256_t *in_RDI;
  long in_R8;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vector<long,_std::allocator<long>_> *in_stack_00000008;
  vector<__int128,_std::allocator<__int128>_> *in_stack_00000010;
  undefined4 in_stack_0000001c;
  undefined1 in_stack_00000020 [16];
  S2Status *in_stack_00000038;
  int256_t phi;
  int64_t xn_1;
  int64_t l2;
  int64_t xm;
  int256_t phi_xn_sum;
  int64_t phi_xn;
  int64_t xn;
  int64_t pi_min_sparse;
  int64_t pi_min_clustered;
  int64_t l;
  int64_t min_hard;
  int64_t min_sparse;
  int64_t min_clustered;
  int64_t min_trivial;
  uint128_t x2;
  int64_t prime;
  int64_t b;
  S2Status status;
  int64_t pi_x13;
  int64_t pi_sqrty;
  PiTable pi;
  int64_t thread_threshold;
  int64_t x13;
  undefined8 in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  uint64_t in_stack_fffffffffffffbb8;
  PiTable *in_stack_fffffffffffffbc0;
  int64_t in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  S2Status *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  int256_t *in_stack_fffffffffffffbf0;
  type_conflict3 *in_stack_fffffffffffffbf8;
  int256_t *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 uVar14;
  uint64_t in_stack_fffffffffffffc58;
  PiTable *in_stack_fffffffffffffc60;
  int256_t local_2d8;
  type_conflict3 *local_2b8;
  undefined1 local_2a8 [16];
  type_conflict3 *local_290;
  long local_288;
  long local_280;
  size_type local_230;
  type_conflict3 *local_228;
  undefined8 local_218;
  undefined8 local_210;
  type_conflict3 *local_200;
  long local_1f8;
  long local_1f0;
  int256_t local_1e8;
  long local_1c0;
  type_conflict3 *local_1b8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  type_conflict3 *local_190;
  int64_t local_188;
  int64_t local_180;
  size_type local_178;
  long local_170;
  long local_168;
  long local_160;
  unsigned___int128 *local_158;
  undefined1 local_148 [16];
  unsigned___int128 *local_130;
  undefined1 local_128 [16];
  long local_110;
  undefined1 local_108 [16];
  uint64_t local_f8;
  size_type local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int64_t local_b0;
  int64_t local_98 [5];
  undefined8 local_70;
  unsigned___int128 *local_68;
  undefined8 local_58;
  undefined8 local_50;
  unsigned___int128 *local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDX;
  primesum::int256_t::int256_t<int,void>(in_RDI,0);
  local_50 = local_20;
  local_58 = local_28;
  x_08._8_8_ = in_stack_fffffffffffffc18;
  x_08._0_8_ = in_stack_fffffffffffffc10;
  local_68 = primesum::iroot<3,unsigned__int128>((unsigned___int128)x_08);
  local_70 = 1000;
  local_48 = local_68;
  iVar4 = primesum::ideal_num_threads
                    (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbc8,
                     (int64_t)in_stack_fffffffffffffbc0);
  primesum::PiTable::PiTable(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  primesum::isqrt<long>(CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  local_98[0] = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_b0 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_e0 = local_20;
  local_e8 = local_28;
  auVar12._8_8_ = in_stack_fffffffffffffbc8;
  auVar12._0_8_ = in_stack_fffffffffffffbc0;
  primesum::S2Status::S2Status(in_stack_fffffffffffffbd8,(int128_t)auVar12);
  psVar5 = (size_type *)std::max<long>(&local_40,local_98);
  auVar13._8_8_ = in_stack_fffffffffffffbe0;
  auVar13._0_8_ = in_stack_fffffffffffffbe8;
  local_f0 = *psVar5;
  while (local_f0 = local_f0 + 1, (long)local_f0 <= local_b0) {
    puVar6 = (uint64_t *)
             std::vector<long,_std::allocator<long>_>::operator[](in_stack_00000008,local_f0);
    local_f8 = *puVar6;
    auVar12 = __udivti3(local_28,local_20,local_f8,(long)local_f8 >> 0x3f);
    local_108 = auVar12;
    auVar12 = __udivti3(auVar12._0_8_,auVar12._8_8_,local_f8,(long)local_f8 >> 0x3f);
    a._8_8_ = in_stack_fffffffffffffbc8;
    a._0_8_ = in_stack_fffffffffffffbc0;
    local_128 = auVar12;
    local_110 = primesum::min<unsigned__int128,long>((unsigned___int128)a,in_stack_fffffffffffffbb8)
    ;
    x_05._4_4_ = in_stack_fffffffffffffbd4;
    x_05._0_4_ = in_stack_fffffffffffffbd0;
    x_05._8_8_ = in_stack_fffffffffffffbd8;
    local_148 = local_108;
    local_158 = primesum::isqrt<unsigned__int128>((unsigned___int128)x_05);
    local_160 = local_38 / (long)local_f8;
    local_170 = local_30 / (long)local_f8;
    local_130 = local_158;
    plVar7 = std::max<long>(&local_170,(long *)&local_f8);
    local_168 = *plVar7;
    local_130 = (unsigned___int128 *)
                primesum::in_between<long,long,long>(local_168,(long)local_130,local_30);
    local_160 = primesum::in_between<long,long,long>(local_168,local_160,local_30);
    local_178 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_180 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_188 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    while( true ) {
      uVar3 = local_108._0_8_;
      if ((long)local_178 <= local_180) break;
      uVar14 = local_108._8_8_;
      std::vector<long,_std::allocator<long>_>::operator[](in_stack_00000008,local_178);
      local_1a8 = uVar3;
      x_02._8_8_ = in_stack_fffffffffffffbc8;
      x_02._0_8_ = in_stack_fffffffffffffbc0;
      local_1a0 = uVar14;
      local_1b8 = primesum::fast_div<unsigned__int128,long>
                            ((unsigned___int128)x_02,in_stack_fffffffffffffbb8);
      local_190 = local_1b8;
      iVar8 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_1c0 = (iVar8 - local_f0) + 2;
      __n = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      puVar9 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_stack_00000010,__n);
      uVar1 = *puVar9;
      uVar2 = puVar9[1];
      puVar9 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_stack_00000010,local_f0 - 1);
      uVar11 = uVar1 - *puVar9;
      local_1f8 = uVar11 + 1;
      local_1f0 = ((uVar2 - puVar9[1]) - (ulong)(uVar1 < *puVar9)) +
                  (ulong)(0xfffffffffffffffe < uVar11);
      x_00._8_7_ = in_stack_fffffffffffffbb0;
      x_00._0_8_ = in_stack_fffffffffffffba8;
      x_00[0xf] = in_stack_fffffffffffffbb7;
      primesum::int256_t::int256_t<__int128,void>(&local_1e8,(__int128)x_00);
      uVar3 = local_108._0_8_;
      uVar14 = local_108._8_8_;
      std::vector<long,_std::allocator<long>_>::operator[]
                (in_stack_00000008,(local_f0 - 1) + local_1c0);
      local_218 = uVar3;
      x_03._8_8_ = in_stack_fffffffffffffbc8;
      x_03._0_8_ = in_stack_fffffffffffffbc0;
      local_210 = uVar14;
      local_228 = primesum::fast_div<unsigned__int128,long>
                            ((unsigned___int128)x_03,in_stack_fffffffffffffbb8);
      local_200 = local_228;
      plVar7 = std::max<long>((long *)&local_200,(long *)&local_130);
      local_200 = (type_conflict3 *)*plVar7;
      local_230 = primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8)
      ;
      primesum::int256_t::operator*(in_stack_fffffffffffffbf0,auVar13._0_8_);
      puVar9 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_stack_00000010,local_178);
      uVar1 = *puVar9;
      in_stack_fffffffffffffc08 = (int256_t *)puVar9[1];
      puVar9 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_stack_00000010,local_230);
      local_288 = uVar1 - *puVar9;
      local_280 = (long)in_stack_fffffffffffffc08 + (-(ulong)(uVar1 < *puVar9) - puVar9[1]);
      x_06._8_8_ = in_stack_fffffffffffffbf8;
      x_06._0_8_ = in_stack_fffffffffffffbf0;
      primesum::int256_t::operator*(in_stack_fffffffffffffc08,(__int128)x_06);
      primesum::int256_t::operator+=(auVar13._8_8_,(int256_t *)in_stack_fffffffffffffbd8);
      local_178 = local_230;
    }
    for (; local_188 < (long)local_178; local_178 = local_178 - 1) {
      auVar13 = local_108;
      std::vector<long,_std::allocator<long>_>::operator[](in_stack_00000008,local_178);
      x_04._8_8_ = in_stack_fffffffffffffbc8;
      x_04._0_8_ = in_stack_fffffffffffffbc0;
      local_2a8 = auVar13;
      in_stack_fffffffffffffbf8 =
           primesum::fast_div<unsigned__int128,long>
                     ((unsigned___int128)x_04,in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbd0 = SUB84(in_stack_00000010,0);
      in_stack_fffffffffffffbd4 = (int)((ulong)in_stack_00000010 >> 0x20);
      in_stack_fffffffffffffbf0 = extraout_RDX;
      local_2b8 = in_stack_fffffffffffffbf8;
      local_290 = in_stack_fffffffffffffbf8;
      in_stack_fffffffffffffbd8 =
           (S2Status *)
           primesum::PiTable::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      pvVar10 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                          ((vector<__int128,_std::allocator<__int128>_> *)
                           CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                           (size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffbc0 = *(PiTable **)pvVar10;
      in_stack_fffffffffffffbc8 = *(int64_t *)((long)pvVar10 + 8);
      std::vector<__int128,_std::allocator<__int128>_>::operator[](in_stack_00000010,local_f0 - 1);
      x_01._8_7_ = in_stack_fffffffffffffbb0;
      x_01._0_8_ = in_stack_fffffffffffffba8;
      x_01[0xf] = in_stack_fffffffffffffbb7;
      primesum::int256_t::int256_t<__int128,void>(&local_2d8,(__int128)x_01);
      in_stack_fffffffffffffbb8 = local_f8;
      std::vector<long,_std::allocator<long>_>::operator[](in_stack_00000008,local_178);
      x_07._8_8_ = in_stack_fffffffffffffbf8;
      x_07._0_8_ = in_stack_fffffffffffffbf0;
      primesum::int256_t::operator*(in_stack_fffffffffffffc08,(__int128)x_07);
      primesum::int256_t::operator+=(auVar13._8_8_,(int256_t *)in_stack_fffffffffffffbd8);
    }
    in_stack_fffffffffffffbb7 = primesum::is_print();
    if ((bool)in_stack_fffffffffffffbb7) {
      limit._8_4_ = iVar4;
      limit._0_8_ = in_stack_00000010;
      limit._12_4_ = in_stack_0000001c;
      primesum::S2Status::print(in_stack_00000038,(int128_t)in_stack_00000020,(int128_t)limit);
    }
  }
  primesum::PiTable::~PiTable((PiTable *)0x14bf01);
  return in_RDI;
}

Assistant:

res_t S2_easy_OpenMP(uint128_t x,
                     int64_t y,
                     int64_t z,
                     int64_t c,
                     Primes& primes,
                     PrimeSums& prime_sums,
                     int threads)
{
  res_t s2_easy = 0;
  int64_t x13 = iroot<3>(x);
  int64_t thread_threshold = 1000;
  threads = ideal_num_threads(threads, x13, thread_threshold);
  using PS = typename PrimeSums::value_type;

  PiTable pi(y);
  int64_t pi_sqrty = pi[isqrt(y)];
  int64_t pi_x13 = pi[x13];
  S2Status status(x);

  #pragma omp parallel for schedule(dynamic) num_threads(threads) reduction(+: s2_easy)
  for (int64_t b = max(c, pi_sqrty) + 1; b <= pi_x13; b++)
  {
    int64_t prime = primes[b];
    uint128_t x2 = x / prime;
    int64_t min_trivial = min(x2 / prime, y);
    int64_t min_clustered = (int64_t) isqrt(x2);
    int64_t min_sparse = z / prime;
    int64_t min_hard = max(y / prime, prime);

    min_clustered = in_between(min_hard, min_clustered, y);
    min_sparse = in_between(min_hard, min_sparse, y);

    int64_t l = pi[min_trivial];
    int64_t pi_min_clustered = pi[min_clustered];
    int64_t pi_min_sparse = pi[min_sparse];

    // Find all clustered easy leaves:
    // n = primes[b] * primes[l]
    // x / n <= y && phi(x / n, b - 1) == phi(x / m, b - 1)
    // where phi(x / n, b - 1) = pi(x / n) - b + 2
    while (l > pi_min_clustered)
    {
      int64_t xn = (int64_t) fast_div(x2, primes[l]);
      int64_t phi_xn = pi[xn] - b + 2;
      res_t phi_xn_sum = prime_sums[pi[xn]] + 1 - prime_sums[b - 1];
      int64_t xm = (int64_t) fast_div(x2, primes[b + phi_xn - 1]);
      xm = max(xm, min_clustered);
      int64_t l2 = pi[xm];
      s2_easy += (phi_xn_sum * prime) * (prime_sums[l] - prime_sums[l2]);
      l = l2;
    }

    // Find all sparse easy leaves:
    // n = primes[b] * primes[l]
    // x / n <= y && phi(x / n, b - 1) = pi(x / n) - b + 2
    for (; l > pi_min_sparse; l--)
    {
      int64_t xn = (int64_t) fast_div(x2, primes[l]);
      res_t phi = prime_sums[pi[xn]] + 1 - prime_sums[b - 1];
      s2_easy += phi * ((PS) prime * primes[l]);
    }

    if (is_print())
      status.print(b, pi_x13);
  }

  return s2_easy;
}